

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::diag_kronecker_product_test(example *ec1,example *ec2,example *ec,int oas)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  VW::dealloc_example((_func_void_void_ptr *)0x0,ec,(_func_void_void_ptr *)0x0);
  copy_example_data(ec,ec1,oas);
  ec->total_sum_feat_sq = 0.0;
  puVar4 = (ec1->super_example_predict).indices._begin;
  qsort(puVar4,(long)(ec1->super_example_predict).indices._end - (long)puVar4,1,cmpfunc);
  puVar4 = (ec2->super_example_predict).indices._begin;
  qsort(puVar4,(long)(ec2->super_example_predict).indices._end - (long)puVar4,1,cmpfunc);
  puVar4 = (ec1->super_example_predict).indices._begin;
  if ((ec1->super_example_predict).indices._end != puVar4) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      puVar3 = (ec2->super_example_predict).indices._begin;
      if ((ulong)((long)(ec2->super_example_predict).indices._end - (long)puVar3) <= uVar5) {
        return;
      }
      bVar1 = puVar4[uVar6];
      bVar2 = puVar3[uVar5];
      if (bVar1 < bVar2) {
        uVar6 = uVar6 + 1;
      }
      else {
        if (bVar1 <= bVar2) {
          diag_kronecker_prod_fs_test
                    ((ec1->super_example_predict).feature_space + bVar1,
                     (ec2->super_example_predict).feature_space + bVar2,
                     (ec->super_example_predict).feature_space + bVar1,&ec->total_sum_feat_sq,
                     ec1->total_sum_feat_sq,ec2->total_sum_feat_sq);
          uVar6 = uVar6 + 1;
        }
        uVar5 = uVar5 + 1;
      }
      puVar4 = (ec1->super_example_predict).indices._begin;
    } while (uVar6 < (ulong)((long)(ec1->super_example_predict).indices._end - (long)puVar4));
  }
  return;
}

Assistant:

void diag_kronecker_product_test(example& ec1, example& ec2, example& ec, int oas = false)
    {
        //copy_example_data(&ec, &ec1, oas); //no_feat false, oas: true
        VW::dealloc_example(nullptr, ec, nullptr); //clear ec
        copy_example_data(&ec, &ec1, oas);

        ec.total_sum_feat_sq = 0.0;  //sort namespaces.  pass indices array into sort...template (leave this to the end)
        
        qsort(ec1.indices.begin(), ec1.indices.size(), sizeof(namespace_index), cmpfunc);
        qsort(ec2.indices.begin(), ec2.indices.size(), sizeof(namespace_index), cmpfunc);
        
        size_t idx1 = 0;
        size_t idx2 = 0;
        while (idx1 < ec1.indices.size() && idx2 < ec2.indices.size())
        //for (size_t idx1 = 0, idx2 = 0; idx1 < ec1.indices.size() && idx2 < ec2.indices.size(); idx1++)
        {
            namespace_index c1 = ec1.indices[idx1];
            namespace_index c2 = ec2.indices[idx2];
            if (c1 < c2)
                idx1++;
            else if (c1 > c2)
                idx2++;
            else{
                diag_kronecker_prod_fs_test(ec1.feature_space[c1], ec2.feature_space[c2], ec.feature_space[c1], ec.total_sum_feat_sq, ec1.total_sum_feat_sq, ec2.total_sum_feat_sq);
                idx1++;
                idx2++;
            }
        }
    }